

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::Formatter::formatNodeList
                (String *sb,uint32_t formatFlags,BaseBuilder *builder,BaseNode *begin,BaseNode *end)

{
  Error EVar1;
  BaseNode *node;
  
  if (begin != end) {
    do {
      EVar1 = formatNode(sb,formatFlags,builder,begin);
      if (EVar1 != 0) {
        return EVar1;
      }
      EVar1 = String::_opChar(sb,1,'\n');
      if (EVar1 != 0) {
        return EVar1;
      }
      begin = (begin->field_0).field_0._next;
    } while (begin != end);
  }
  return 0;
}

Assistant:

Error formatNodeList(
  String& sb,
  uint32_t formatFlags,
  const BaseBuilder* builder,
  const BaseNode* begin,
  const BaseNode* end) noexcept {

  const BaseNode* node = begin;
  while (node != end) {
    ASMJIT_PROPAGATE(formatNode(sb, formatFlags, builder, node));
    ASMJIT_PROPAGATE(sb.append('\n'));
    node = node->next();
  }
  return kErrorOk;
}